

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O0

FunctionMatch * __thiscall
Jinx::Impl::Parser::CheckFunctionCall
          (FunctionMatch *__return_storage_ptr__,Parser *this,LibraryIPtr *library,
          SymbolListCItr currSym,SymbolListCItr endSym,bool skipInitialParam)

{
  bool bVar1;
  element_type *this_00;
  reference ppFVar2;
  size_type sVar3;
  size_type sVar4;
  undefined1 local_b0 [8];
  FunctionMatch newMatch;
  SymbolListCItr currentSymbol;
  FunctionSignature *functionSig;
  const_iterator __end2;
  const_iterator __begin2;
  FunctionPtrList *__range2;
  undefined1 local_50 [8];
  FunctionPtrList functionPtrList;
  bool skipInitialParam_local;
  LibraryIPtr *library_local;
  Parser *this_local;
  SymbolListCItr endSym_local;
  SymbolListCItr currSym_local;
  FunctionMatch *match;
  
  functionPtrList.
  super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = skipInitialParam;
  this_00 = std::__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)library);
  Library::Functions((FunctionPtrList *)local_50,this_00);
  FunctionMatch::FunctionMatch(__return_storage_ptr__);
  __end2 = std::
           vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
           ::begin((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                    *)local_50);
  functionSig = (FunctionSignature *)
                std::
                vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                ::end((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                       *)local_50);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Jinx::Impl::FunctionSignature_*const_*,_std::vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>_>
                                *)&functionSig);
    if (!bVar1) {
      std::
      vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
      ::~vector((vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                 *)local_50);
      return __return_storage_ptr__;
    }
    ppFVar2 = __gnu_cxx::
              __normal_iterator<const_Jinx::Impl::FunctionSignature_*const_*,_std::vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>_>
              ::operator*(&__end2);
    newMatch.partData.
    super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)currSym._M_current;
    CheckFunctionCall((FunctionMatch *)local_b0,this,*ppFVar2,currSym,endSym,
                      (bool)(functionPtrList.
                             super__Vector_base<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1));
    if (local_b0 != (undefined1  [8])0x0) {
      if (__return_storage_ptr__->signature != (FunctionSignature *)0x0) {
        sVar3 = std::
                vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ::size(&__return_storage_ptr__->partData);
        sVar4 = std::
                vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                ::size((vector<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                        *)&newMatch);
        if (sVar4 <= sVar3) goto LAB_0014d663;
      }
      FunctionMatch::operator=(__return_storage_ptr__,(FunctionMatch *)local_b0);
    }
LAB_0014d663:
    FunctionMatch::~FunctionMatch((FunctionMatch *)local_b0);
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::FunctionSignature_*const_*,_std::vector<const_Jinx::Impl::FunctionSignature_*,_Jinx::Allocator<const_Jinx::Impl::FunctionSignature_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

inline_t Parser::FunctionMatch Parser::CheckFunctionCall(LibraryIPtr library, SymbolListCItr currSym, SymbolListCItr endSym, bool skipInitialParam) const
	{
		const auto functionPtrList = library->Functions();

		FunctionMatch match;
		for (const auto functionSig : functionPtrList)
		{
			auto currentSymbol = currSym;
			auto newMatch = CheckFunctionCall(*functionSig, currentSymbol, endSym, skipInitialParam);
			if (newMatch.signature)
			{
				if (!match.signature || match.partData.size() < newMatch.partData.size())
					match = newMatch;
			}
		}
		return match;
	}